

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O2

void uv__stream_io(uv_loop_t *loop,uv__io_t *w,uint events)

{
  byte *pbVar1;
  size_t sVar2;
  int iVar3;
  long lVar4;
  int *piVar5;
  uint *puVar6;
  cmsghdr *pcVar7;
  uint uVar8;
  uint uVar9;
  uv_stream_t *stream;
  ulong uVar10;
  uint uVar11;
  uint *puVar12;
  ulong uVar13;
  ulong uVar14;
  undefined8 unaff_R14;
  undefined8 uStack_1d0;
  uv_buf_t local_1c8;
  uint local_1b4;
  uint *local_1b0;
  uint local_1a8;
  int local_1a4;
  uv_stream_t *local_1a0;
  ulong local_198;
  cmsghdr *local_190;
  size_t local_188;
  msghdr msg;
  int error;
  undefined4 uStack_144;
  size_t sStack_140;
  
  uVar11 = w[-3].fd;
  if ((0xe < uVar11) || ((0x5080U >> (uVar11 & 0x1f) & 1) == 0)) {
    __assert_fail("stream->type == UV_TCP || stream->type == UV_NAMED_PIPE || stream->type == UV_TTY"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/stream.c"
                  ,0x509,"void uv__stream_io(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  if ((*(uint *)w[-1].pending_queue & 1) != 0) {
    __assert_fail("!(stream->flags & UV_HANDLE_CLOSING)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/stream.c"
                  ,0x50a,"void uv__stream_io(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  stream = (uv_stream_t *)(w[-3].watcher_queue + 1);
  lVar4 = *(long *)&w[-1].pevents;
  if (lVar4 != 0) {
    msg.msg_name = (void *)CONCAT44(msg.msg_name._4_4_,4);
    if ((uVar11 != 7) && (uVar11 != 0xc)) {
      __assert_fail("stream->type == UV_TCP || stream->type == UV_NAMED_PIPE",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/stream.c"
                    ,0x540,"void uv__stream_connect(uv_stream_t *)");
    }
    uVar11 = w[1].pevents;
    if (uVar11 == 0) {
      if (w->fd < 0) {
        __assert_fail("uv__stream_fd(stream) >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/stream.c"
                      ,0x54c,"void uv__stream_connect(uv_stream_t *)");
      }
      getsockopt(w->fd,1,4,&error,(socklen_t *)&msg);
      uVar11 = -error;
      _error = (char *)CONCAT44(uStack_144,uVar11);
    }
    else {
      _error = (char *)CONCAT44(uStack_144,uVar11);
      w[1].pevents = 0;
    }
    if (uVar11 == 0xffffff8d) {
      return;
    }
    w[-1].pevents = 0;
    w[-1].events = 0;
    iVar3 = *(int *)(*(long *)&w[-3].pevents + 0x20);
    if (iVar3 == 0) {
      __assert_fail("uv__has_active_reqs(stream->loop)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/stream.c"
                    ,0x559,"void uv__stream_connect(uv_stream_t *)");
    }
    *(int *)(*(long *)&w[-3].pevents + 0x20) = iVar3 + -1;
    if (((int)uVar11 < 0) || (w + 1 == (uv__io_t *)w[1].cb)) {
      uv__io_stop(*(uv_loop_t **)&w[-3].pevents,w,4);
      uVar11 = error;
    }
    if (*(code **)(lVar4 + 0x40) != (code *)0x0) {
      (**(code **)(lVar4 + 0x40))(lVar4);
      uVar11 = error;
    }
    if (w->fd == -1) {
      return;
    }
    if (-1 < (int)uVar11) {
      return;
    }
    uv__stream_flush_write_queue(stream,-0x7d);
    uv__write_callbacks(stream);
    return;
  }
  iVar3 = w->fd;
  if (iVar3 < 0) {
    __assert_fail("uv__stream_fd(stream) >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/stream.c"
                  ,0x511,"void uv__stream_io(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  if ((events & 0x19) != 0) {
    *(uint *)w[-1].pending_queue = *(uint *)w[-1].pending_queue & 0xfffffbfe;
    if (uVar11 == 7) {
      uVar14 = CONCAT71((int7)((ulong)unaff_R14 >> 8),*(int *)&w[2].cb != 0);
    }
    else {
      uVar14 = 0;
    }
    local_1b0 = &w[1].events;
    iVar3 = 0x20;
    do {
      if (((w[-1].watcher_queue[1] == (void *)0x0) ||
          (((ulong)w[-1].pending_queue[0] & 0x1000) == 0)) || (iVar3 == 0)) goto LAB_0044aaf6;
      if (w[-1].watcher_queue[0] == (void *)0x0) {
        __assert_fail("stream->alloc_cb != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/stream.c"
                      ,0x46f,"void uv__read(uv_stream_t *)");
      }
      local_1c8 = uv_buf_init((char *)0x0,0);
      (*(code *)w[-1].watcher_queue[0])(stream,0x10000,&local_1c8);
      if ((local_1c8.base == (char *)0x0) || (local_1c8.len == 0)) {
        uStack_1d0 = 0xffffffffffffff97;
        goto LAB_0044aa4f;
      }
      if (w->fd < 0) {
        __assert_fail("uv__stream_fd(stream) >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/stream.c"
                      ,0x47a,"void uv__read(uv_stream_t *)");
      }
      local_1a4 = iVar3 + -1;
      if ((char)uVar14 == '\0') {
        while( true ) {
          lVar4 = read(w->fd,local_1c8.base,local_1c8.len);
          if (-1 < lVar4) break;
          piVar5 = __errno_location();
          iVar3 = *piVar5;
          if (iVar3 != 4) goto LAB_0044aa2c;
        }
      }
      else {
        msg.msg_flags = 0;
        msg.msg_iovlen = 1;
        msg.msg_name = (void *)0x0;
        msg.msg_namelen = 0;
        msg.msg_controllen = 0x110;
        msg.msg_control = &error;
        msg.msg_iov = (iovec *)&local_1c8;
        while (lVar4 = uv__recvmsg(w->fd,&msg,0), lVar4 < 0) {
          piVar5 = __errno_location();
          iVar3 = *piVar5;
          if (iVar3 != 4) goto LAB_0044aa2c;
        }
      }
      if (lVar4 == 0) {
        uv__stream_eof(stream,&local_1c8);
        goto LAB_0044aaf6;
      }
      local_188 = local_1c8.len;
      if ((char)uVar14 != '\0') {
        pcVar7 = (cmsghdr *)msg.msg_control;
        if (msg.msg_controllen < 0x10) {
          pcVar7 = (cmsghdr *)0x0;
        }
        local_1a8 = (uint)uVar14;
        local_1b4 = events;
        local_1a0 = stream;
        while (stream = local_1a0, events = local_1b4, pcVar7 != (cmsghdr *)0x0) {
          if (pcVar7->cmsg_type == 1) {
            uVar14 = 0xffffffff;
            uVar11 = 0;
            do {
              uVar9 = uVar11;
              uVar14 = (ulong)((int)uVar14 + 1);
              sVar2 = uVar14 * 4 + 0x10;
              uVar11 = uVar9 + 1;
            } while ((long)sVar2 < (long)pcVar7->cmsg_len);
            if (sVar2 != pcVar7->cmsg_len) {
              __assert_fail("start + CMSG_LEN(count * sizeof(*pi)) == end",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/stream.c"
                            ,0x43b,"int uv__stream_recv_cmsg(uv_stream_t *, struct msghdr *)");
            }
            uVar13 = (ulong)uVar9;
            uVar10 = 0;
            puVar6 = local_1b0;
            local_198 = uVar13;
            local_190 = pcVar7;
LAB_0044a91a:
            if (uVar13 != uVar10) {
              uVar11 = *(uint *)((long)&pcVar7[1].cmsg_len + uVar10 * 4);
              puVar12 = puVar6;
              if (*puVar6 == 0xffffffff) goto LAB_0044a9c0;
              puVar6 = *(uint **)&w[1].fd;
              if (puVar6 != (uint *)0x0) {
                uVar9 = *puVar6;
                uVar8 = puVar6[1];
                if (uVar9 == uVar8) {
                  puVar6 = (uint *)uv__realloc(puVar6,(ulong)(uVar9 + 7) * 4 + 0xc);
                  if (puVar6 == (uint *)0x0) goto LAB_0044aaba;
                  *puVar6 = uVar9 + 8;
                  *(uint **)&w[1].fd = puVar6;
                  uVar8 = puVar6[1];
                  puVar12 = local_1b0;
                  uVar13 = local_198;
                }
LAB_0044a9ab:
                puVar6[1] = uVar8 + 1;
                puVar6 = puVar6 + (ulong)uVar8 + 2;
                pcVar7 = local_190;
                goto LAB_0044a9c0;
              }
              puVar6 = (uint *)uv__malloc(0x28);
              if (puVar6 != (uint *)0x0) {
                puVar6[0] = 8;
                puVar6[1] = 0;
                *(uint **)&w[1].fd = puVar6;
                uVar8 = 0;
                puVar12 = local_1b0;
                uVar13 = local_198;
                goto LAB_0044a9ab;
              }
LAB_0044aaba:
              pcVar7 = local_190;
              if (uVar14 < uVar10) {
                uVar14 = uVar10;
              }
              for (; stream = local_1a0, uVar14 != uVar10; uVar10 = uVar10 + 1) {
                uv__close(*(int *)((long)&pcVar7[1].cmsg_len + uVar10 * 4));
              }
              (*(code *)w[-1].watcher_queue[1])(local_1a0,0xfffffffffffffff4,&local_1c8);
              events = local_1b4;
              goto LAB_0044aaf6;
            }
            goto LAB_0044a9e2;
          }
          fprintf(_stderr,"ignoring non-SCM_RIGHTS ancillary data: %d\n");
LAB_0044a9e2:
          pcVar7 = __cmsg_nxthdr((msghdr *)&msg,pcVar7);
          uVar14 = (ulong)local_1a8;
        }
      }
      (*(code *)w[-1].watcher_queue[1])(stream,lVar4,&local_1c8);
      iVar3 = local_1a4;
    } while ((long)local_188 <= lVar4);
    pbVar1 = (byte *)((long)w[-1].pending_queue + 1);
    *pbVar1 = *pbVar1 | 4;
    goto LAB_0044aaf6;
  }
  goto LAB_0044ab03;
LAB_0044a9c0:
  *puVar6 = uVar11;
  uVar10 = uVar10 + 1;
  puVar6 = puVar12;
  goto LAB_0044a91a;
LAB_0044aa2c:
  if (iVar3 == 0xb) {
    if (((ulong)w[-1].pending_queue[0] & 0x1000) != 0) {
      uv__io_start(*(uv_loop_t **)&w[-3].pevents,w,1);
    }
    uStack_1d0 = 0;
LAB_0044aa4f:
    (*(code *)w[-1].watcher_queue[1])(stream,uStack_1d0,&local_1c8);
  }
  else {
    (*(code *)w[-1].watcher_queue[1])(stream,(long)-iVar3,&local_1c8);
    if ((*(uint *)w[-1].pending_queue >> 0xc & 1) != 0) {
      *(uint *)w[-1].pending_queue = *(uint *)w[-1].pending_queue & 0xffffefff;
      uv__io_stop(*(uv_loop_t **)&w[-3].pevents,w,1);
      iVar3 = uv__io_active(w,4);
      if (((iVar3 == 0) && (uVar11 = *(uint *)w[-1].pending_queue, (uVar11 & 4) != 0)) &&
         (*(uint *)w[-1].pending_queue = uVar11 & 0xfffffffb, (uVar11 & 8) != 0)) {
        piVar5 = (int *)(*(long *)&w[-3].pevents + 8);
        *piVar5 = *piVar5 + -1;
      }
    }
  }
LAB_0044aaf6:
  iVar3 = w->fd;
  if (iVar3 == -1) {
    return;
  }
LAB_0044ab03:
  if (((events & 0x10) != 0) && (((ulong)w[-1].pending_queue[0] & 0x1c00) == 0x1400)) {
    _error = (char *)0x0;
    sStack_140 = 0;
    uv__stream_eof(stream,(uv_buf_t *)&error);
    iVar3 = w->fd;
  }
  if ((events & 0x1c) == 0) {
    return;
  }
  if (iVar3 == -1) {
    return;
  }
  uv__write(stream);
  uv__write_callbacks(stream);
  if (w + 1 != (uv__io_t *)w[1].cb) {
    return;
  }
  uv__io_stop(*(uv_loop_t **)&w[-3].pevents,w,4);
  if ((*(uint *)w[-1].pending_queue & 0x301) != 0x100) {
    return;
  }
  lVar4 = *(long *)&w[-1].fd;
  if (lVar4 == 0) {
    __assert_fail("stream->shutdown_req",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/stream.c"
                  ,0x2b3,"void uv__drain(uv_stream_t *)");
  }
  *(undefined8 *)&w[-1].fd = 0;
  *(uint *)w[-1].pending_queue = *(uint *)w[-1].pending_queue & 0xfffffcfe;
  iVar3 = *(int *)(*(long *)&w[-3].pevents + 0x20);
  if (iVar3 == 0) {
    __assert_fail("uv__has_active_reqs(stream->loop)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/stream.c"
                  ,0x2b8,"void uv__drain(uv_stream_t *)");
  }
  *(int *)(*(long *)&w[-3].pevents + 0x20) = iVar3 + -1;
  iVar3 = shutdown(w->fd,1);
  if (iVar3 != 0) {
    piVar5 = __errno_location();
    if (*piVar5 != 0) {
      iVar3 = -*piVar5;
      goto LAB_0044abdc;
    }
  }
  pbVar1 = (byte *)((long)w[-1].pending_queue + 1);
  *pbVar1 = *pbVar1 | 2;
  iVar3 = 0;
LAB_0044abdc:
  if (*(code **)(lVar4 + 0x48) != (code *)0x0) {
    (**(code **)(lVar4 + 0x48))(lVar4,iVar3);
  }
  return;
}

Assistant:

static void uv__stream_io(uv_loop_t* loop, uv__io_t* w, unsigned int events) {
  uv_stream_t* stream;

  stream = container_of(w, uv_stream_t, io_watcher);

  assert(stream->type == UV_TCP ||
         stream->type == UV_NAMED_PIPE ||
         stream->type == UV_TTY);
  assert(!(stream->flags & UV_HANDLE_CLOSING));

  if (stream->connect_req) {
    uv__stream_connect(stream);
    return;
  }

  assert(uv__stream_fd(stream) >= 0);

  /* Ignore POLLHUP here. Even if it's set, there may still be data to read. */
  if (events & (POLLIN | POLLERR | POLLHUP))
    uv__read(stream);

  if (uv__stream_fd(stream) == -1)
    return;  /* read_cb closed stream. */

  /* Short-circuit iff POLLHUP is set, the user is still interested in read
   * events and uv__read() reported a partial read but not EOF. If the EOF
   * flag is set, uv__read() called read_cb with err=UV_EOF and we don't
   * have to do anything. If the partial read flag is not set, we can't
   * report the EOF yet because there is still data to read.
   */
  if ((events & POLLHUP) &&
      (stream->flags & UV_HANDLE_READING) &&
      (stream->flags & UV_HANDLE_READ_PARTIAL) &&
      !(stream->flags & UV_HANDLE_READ_EOF)) {
    uv_buf_t buf = { NULL, 0 };
    uv__stream_eof(stream, &buf);
  }

  if (uv__stream_fd(stream) == -1)
    return;  /* read_cb closed stream. */

  if (events & (POLLOUT | POLLERR | POLLHUP)) {
    uv__write(stream);
    uv__write_callbacks(stream);

    /* Write queue drained. */
    if (QUEUE_EMPTY(&stream->write_queue))
      uv__drain(stream);
  }
}